

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

Value * __thiscall
BasicBlock::GetValueForConditionalBranch
          (BasicBlock *this,BranchInstr *branch,Opnd *opnd,GlobOpt *globOpt,
          GlobHashTable *localSymToValueMap)

{
  BOOLEAN BVar1;
  SymID i;
  StackSym *pSVar2;
  Value *pVVar3;
  Value *pVVar4;
  Loop *curLoop;
  Loop *pLVar5;
  
  if ((opnd == (Opnd *)0x0) || (pSVar2 = IR::Opnd::GetStackSym(opnd), pSVar2 == (StackSym *)0x0)) {
    pVVar4 = (Value *)0x0;
  }
  else {
    pSVar2 = IR::Opnd::GetStackSym(opnd);
    pVVar3 = FindValueInLocalThenGlobalValueTableAndUpdate
                       (this,globOpt,localSymToValueMap,&branch->super_Instr,(Sym *)0x0,
                        &pSVar2->super_Sym);
    pVVar4 = (Value *)0x0;
    if (((pVVar3 != (Value *)0x0) && (pVVar4 = pVVar3, this->loop != (Loop *)0x0)) &&
       (i = GlobOpt::GetVarSymID(globOpt,pSVar2), i != (pSVar2->super_Sym).m_id)) {
      pLVar5 = this->loop;
      do {
        BVar1 = BVSparse<Memory::JitArenaAllocator>::Test(pLVar5->symsAssignedToInLoop,i);
        if (BVar1 != '\0') {
          return (Value *)0x0;
        }
        pLVar5 = pLVar5->parent;
      } while (pLVar5 != (Loop *)0x0);
    }
  }
  return pVVar4;
}

Assistant:

Value* BasicBlock::GetValueForConditionalBranch(
    IR::BranchInstr* branch,
    IR::Opnd* opnd,
    GlobOpt* globOpt,
    GlobHashTable* localSymToValueMap)
{
    if (!opnd || !opnd->GetStackSym())
    {
        return nullptr;
    }

    StackSym* sym = opnd->GetStackSym();

    Value* val = FindValueInLocalThenGlobalValueTableAndUpdate(
        globOpt,
        localSymToValueMap,
        branch,
        nullptr,
        sym);

    if (val != nullptr && this->loop)
    {
        // If this branch is within a loop, the stack sym is type specialized, and the associated
        // var sym is written to within the loop, then we cannot prove the condition: additional
        // assignments to the type specialized sym might be inserted in a later block.
        SymID varSymID = globOpt->GetVarSymID(sym);
        if (varSymID != sym->m_id && this->loop->IsSymAssignedToInSelfOrParents(varSymID))
        {
            return nullptr;
        }
    }

    return val;
}